

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Imputer::set_allocated_imputeddoublearray
          (Imputer *this,DoubleVector *imputeddoublearray)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_ImputedValue(this);
  if (imputeddoublearray != (DoubleVector *)0x0) {
    submessage_arena = (Arena *)(imputeddoublearray->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      imputeddoublearray =
           (DoubleVector *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&imputeddoublearray->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 4;
    (this->ImputedValue_).imputeddoublearray_ = imputeddoublearray;
  }
  return;
}

Assistant:

void Imputer::set_allocated_imputeddoublearray(::CoreML::Specification::DoubleVector* imputeddoublearray) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_ImputedValue();
  if (imputeddoublearray) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(imputeddoublearray));
    if (message_arena != submessage_arena) {
      imputeddoublearray = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, imputeddoublearray, submessage_arena);
    }
    set_has_imputeddoublearray();
    ImputedValue_.imputeddoublearray_ = imputeddoublearray;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Imputer.imputedDoubleArray)
}